

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  bool attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  poVar2 = std::operator<<(this->m_os,' ');
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"=\"");
  pcVar1 = "we move a directory and overwrite = false";
  if (attribute) {
    pcVar1 = "we move a directory and overwrite = true";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0x24);
  std::operator<<(poVar2,'\"');
  return this;
}

Assistant:

XmlWriter &XmlWriter::writeAttribute(std::string const &name, bool attribute) {
        m_os << ' ' << name << "=\"" << (attribute ? "true" : "false") << '"';
        return *this;
    }